

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkDirFrame.cpp
# Opt level: O1

void __thiscall chrono::fea::ChLinkDirFrame::ConstraintsLoadJacobians(ChLinkDirFrame *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  element_type *peVar7;
  element_type *peVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double *pdVar13;
  Index index;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  DstEvaluatorType dstEvaluator;
  ChMatrix33<double> Jra;
  ChMatrix33<double> Jrb;
  ChStarMatrix33<double> ztilde;
  ChMatrix33<double> Arw;
  ChMatrix33<double> Aro;
  ChMatrix33<double> Aow;
  assign_op<double,_double> local_201;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_200;
  plainobjectbase_evaluator_data<double,_3> local_1e0;
  ChMatrix33<double> local_1d8;
  DstXprType local_190;
  ChQuaternion<double> local_148;
  undefined8 local_128;
  ulong local_120;
  ulong uStack_118;
  undefined8 local_110;
  undefined8 local_108;
  ChMatrix33<double> local_100;
  ChMatrix33<double> local_b8;
  ChMatrix33<double> local_70;
  
  ChMatrix33<double>::ChMatrix33
            (&local_70,
             &(((this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  ChMatrix33<double>::ChMatrix33(&local_b8,&(this->m_csys).rot);
  peVar7 = (this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = (peVar7->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
  dVar1 = *(double *)
           ((long)(peVar7->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data + 8);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar1;
  dVar2 = (this->m_csys).rot.m_data[0];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar2;
  dVar3 = (this->m_csys).rot.m_data[1];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar3;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar3 * dVar1;
  auVar10 = vfmsub231sd_fma(auVar26,auVar16,auVar20);
  dVar3 = *(double *)
           ((long)(peVar7->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data +
           0x10);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar3;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = (this->m_csys).rot.m_data[2];
  auVar10 = vfnmadd231sd_fma(auVar10,auVar28,auVar29);
  dVar4 = *(double *)
           ((long)(peVar7->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data +
           0x18);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar4;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = (this->m_csys).rot.m_data[3];
  auVar11 = vfnmadd231sd_fma(auVar10,auVar30,auVar31);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar2 * dVar1;
  auVar10 = vfmadd231sd_fma(auVar32,auVar16,auVar23);
  auVar10 = vfnmadd231sd_fma(auVar10,auVar30,auVar29);
  auVar10 = vfmadd231sd_fma(auVar10,auVar28,auVar31);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar2 * dVar3;
  auVar9 = vfmadd231sd_fma(auVar33,auVar16,auVar29);
  auVar9 = vfmadd231sd_fma(auVar9,auVar30,auVar23);
  auVar12 = vfnmadd231sd_fma(auVar9,auVar18,auVar31);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar2 * dVar4;
  auVar9 = vfmadd231sd_fma(auVar21,auVar16,auVar31);
  auVar9 = vfnmadd231sd_fma(auVar9,auVar28,auVar23);
  auVar9 = vfmadd231sd_fma(auVar9,auVar18,auVar29);
  local_148.m_data[0] = auVar11._0_8_;
  local_148.m_data[1] = auVar10._0_8_;
  local_148.m_data[2] = auVar12._0_8_;
  local_148.m_data[3] = auVar9._0_8_;
  ChMatrix33<double>::ChMatrix33(&local_100,&local_148);
  peVar8 = (this->m_node).super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)&(peVar8->super_ChNodeFEAxyz).field_0xf0;
  dVar1 = *(double *)&peVar8->field_0xf8;
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       dVar1 * local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3];
  auVar10 = vfmadd231sd_fma(auVar22,auVar17,auVar10);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)&peVar8->field_0x100;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar9 = vfmadd231sd_fma(auVar10,auVar24,auVar9);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       dVar1 * local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4];
  auVar10 = vfmadd231sd_fma(auVar27,auVar17,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar10 = vfmadd231sd_fma(auVar10,auVar24,auVar12);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       dVar1 * local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5];
  auVar11 = vfmadd231sd_fma(auVar19,auVar17,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar11 = vfmadd231sd_fma(auVar11,auVar24,auVar6);
  local_148.m_data[0] = 0.0;
  local_148.m_data[3] = auVar11._0_8_;
  auVar25._0_8_ = -local_148.m_data[3];
  auVar25._8_8_ = auVar11._8_8_ ^ 0x8000000000000000;
  local_148.m_data[1] = (double)vmovlpd_avx(auVar25);
  local_148.m_data[2] = auVar10._0_8_;
  local_128 = 0;
  auVar10 = vunpcklpd_avx(auVar9,auVar10);
  local_120 = auVar10._0_8_ ^ 0x8000000000000000;
  uStack_118 = auVar10._8_8_ ^ 0x8000000000000000;
  local_110 = auVar9._0_8_;
  local_108 = 0;
  local_200.m_src = (SrcEvaluatorType *)&local_1d8;
  local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       1.48219693752374e-323;
  local_200.m_dstExpr = &local_190;
  local_200.m_dst = (DstEvaluatorType *)&local_1e0;
  local_200.m_functor = &local_201;
  local_1e0.data = (double *)local_200.m_dstExpr;
  local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_b8;
  local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&local_148;
  local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (double)&local_b8;
  local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       (double)&local_148;
  Eigen::internal::
  copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_200);
  local_200.m_dst = (DstEvaluatorType *)&local_100;
  ChMatrix33<double>::ChMatrix33<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>
            (&local_1d8,
             (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *)&local_200);
  ChConstraintTwoGeneric::Get_Cq_a((ChRowVectorRef *)&local_200,&this->constraint1);
  if (2 < (long)local_200.m_functor) {
    uVar14 = 3;
    if ((((ulong)local_200.m_dst & 7) == 0) &&
       (uVar15 = (ulong)(-((uint)((ulong)local_200.m_dst >> 3) & 0x1fffffff) & 7), uVar15 < 3)) {
      uVar14 = uVar15;
    }
    if (uVar14 != 0) {
      uVar15 = 0;
      do {
        (((Matrix<double,_3,_3,_1,_3,_3> *)
         &(local_200.m_dst)->
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)->
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array[uVar15]
             = *(double *)
                ((long)local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + uVar15 * 8 + 0x18);
        uVar15 = uVar15 + 1;
      } while (uVar14 != uVar15);
    }
    if (uVar14 < 3) {
      do {
        (((Matrix<double,_3,_3,_1,_3,_3> *)
         &(local_200.m_dst)->
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)->
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array[uVar14]
             = *(double *)
                ((long)local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + uVar14 * 8 + 0x18);
        uVar14 = uVar14 + 1;
      } while (uVar14 != 3);
    }
    ChConstraintTwoGeneric::Get_Cq_a((ChRowVectorRef *)&local_200,&this->constraint2);
    if (2 < (long)local_200.m_functor) {
      uVar14 = 3;
      if ((((ulong)local_200.m_dst & 7) == 0) &&
         (uVar15 = (ulong)(-((uint)((ulong)local_200.m_dst >> 3) & 0x1fffffff) & 7), uVar15 < 3)) {
        uVar14 = uVar15;
      }
      if (uVar14 != 0) {
        uVar15 = 0;
        do {
          (((Matrix<double,_3,_3,_1,_3,_3> *)
           &(local_200.m_dst)->
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)->
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array
          [uVar15] = *(double *)
                      ((long)local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array + uVar15 * 8 + 0x30);
          uVar15 = uVar15 + 1;
        } while (uVar14 != uVar15);
      }
      if (uVar14 < 3) {
        do {
          (((Matrix<double,_3,_3,_1,_3,_3> *)
           &(local_200.m_dst)->
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)->
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array
          [uVar14] = *(double *)
                      ((long)local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array + uVar14 * 8 + 0x30);
          uVar14 = uVar14 + 1;
        } while (uVar14 != 3);
      }
      ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&local_200,&this->constraint1);
      if (5 < (long)local_200.m_functor) {
        pdVar13 = (((Matrix<double,_3,_3,_1,_3,_3> *)
                   &(local_200.m_dst)->
                    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)
                  ->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.
                  array + 3;
        uVar14 = 3;
        if ((((ulong)pdVar13 & 7) == 0) &&
           (uVar15 = (ulong)(-((uint)((ulong)pdVar13 >> 3) & 0x1fffffff) & 7), uVar15 < 3)) {
          uVar14 = uVar15;
        }
        if (uVar14 != 0) {
          uVar15 = 0;
          do {
            pdVar13[uVar15] =
                 local_190.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[uVar15 + 3];
            uVar15 = uVar15 + 1;
          } while (uVar14 != uVar15);
        }
        if (uVar14 < 3) {
          do {
            pdVar13[uVar14] =
                 local_190.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[uVar14 + 3];
            uVar14 = uVar14 + 1;
          } while (uVar14 != 3);
        }
        ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&local_200,&this->constraint2);
        if (5 < (long)local_200.m_functor) {
          pdVar13 = (((Matrix<double,_3,_3,_1,_3,_3> *)
                     &(local_200.m_dst)->
                      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                     )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
                    m_data.array + 3;
          uVar14 = 3;
          if ((((ulong)pdVar13 & 7) == 0) &&
             (uVar15 = (ulong)(-((uint)((ulong)pdVar13 >> 3) & 0x1fffffff) & 7), uVar15 < 3)) {
            uVar14 = uVar15;
          }
          if (uVar14 != 0) {
            uVar15 = 0;
            do {
              pdVar13[uVar15] =
                   local_190.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[uVar15 + 6];
              uVar15 = uVar15 + 1;
            } while (uVar14 != uVar15);
          }
          if (uVar14 < 3) {
            do {
              pdVar13[uVar14] =
                   local_190.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[uVar14 + 6];
              uVar14 = uVar14 + 1;
            } while (uVar14 != 3);
          }
          return;
        }
      }
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, 1, -1>>, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, 1, -1>>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
               );
}

Assistant:

void ChLinkDirFrame::ConstraintsLoadJacobians() {
    // compute jacobians
    ChMatrix33<> Aow(m_body->coord.rot);
    ChMatrix33<> Aro(m_csys.rot);
    ChMatrix33<> Arw(m_csys.rot >> m_body->coord.rot);

    ChVector<> Zo = Aow.transpose() * m_node->GetD();

    ChStarMatrix33<> ztilde(Zo);

    ChMatrix33<> Jrb = Aro.transpose() * ztilde;

    ChMatrix33<> Jra = Arw.transpose();

    constraint1.Get_Cq_a().segment(0, 3) = Jra.row(1);
    constraint2.Get_Cq_a().segment(0, 3) = Jra.row(2);

    constraint1.Get_Cq_b().segment(3, 3) = Jrb.row(1);
    constraint2.Get_Cq_b().segment(3, 3) = Jrb.row(2);
}